

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O1

int ini_save(ini_t *ini,char *data,int size)

{
  ini_internal_property_t *piVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ini_internal_section_t *str;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  
  if (ini == (ini_t *)0x0) {
    iVar12 = 0;
  }
  else {
    if (ini->section_count < 1) {
      uVar11 = 0;
    }
    else {
      lVar10 = (long)size;
      uVar6 = 0;
      uVar11 = 0;
      do {
        str = (ini_internal_section_t *)ini->sections[uVar6].name_large;
        if (str == (ini_internal_section_t *)0x0) {
          str = ini->sections + uVar6;
        }
        uVar2 = sx_strlen(str->name);
        if (0 < (int)uVar2) {
          if ((data != (char *)0x0) && ((int)uVar11 < size)) {
            data[(int)uVar11] = '[';
          }
          lVar8 = (long)(int)(uVar11 + 1);
          uVar4 = (ulong)uVar2;
          if ((int)uVar2 < 2) {
            uVar4 = 1;
          }
          lVar7 = lVar8 << 0x20;
          uVar5 = 0;
          do {
            if ((data != (char *)0x0) && ((long)(lVar8 + uVar5) < lVar10)) {
              data[uVar5 + lVar8] = str->name[uVar5];
            }
            uVar5 = uVar5 + 1;
            lVar7 = lVar7 + 0x100000000;
          } while (uVar4 != uVar5);
          iVar12 = (int)uVar5;
          if ((data != (char *)0x0) && ((int)(uVar11 + iVar12 + 1) < size)) {
            data[lVar7 >> 0x20] = ']';
          }
          if ((data != (char *)0x0) && (iVar3 = uVar11 + iVar12 + 2, iVar3 < size)) {
            data[iVar3] = '\n';
          }
          uVar11 = uVar11 + iVar12 + 3;
        }
        if (0 < ini->property_count) {
          lVar8 = 0;
          do {
            piVar1 = ini->properties;
            if (uVar6 == (uint)piVar1[lVar8].section) {
              pcVar9 = piVar1[lVar8].name;
              if (piVar1[lVar8].name_large != (char *)0x0) {
                pcVar9 = piVar1[lVar8].name_large;
              }
              uVar2 = sx_strlen(pcVar9);
              if (0 < (int)uVar2) {
                uVar4 = 0;
                do {
                  if ((data != (char *)0x0) && ((long)((long)(int)uVar11 + uVar4) < lVar10)) {
                    data[uVar4 + (long)(int)uVar11] = pcVar9[uVar4];
                  }
                  uVar4 = uVar4 + 1;
                } while (uVar2 != uVar4);
                uVar11 = uVar11 + (int)uVar4;
              }
              if ((data != (char *)0x0) && ((int)uVar11 < size)) {
                data[(int)uVar11] = '=';
              }
              pcVar9 = ini->properties[lVar8].value_large;
              if (pcVar9 == (char *)0x0) {
                pcVar9 = ini->properties[lVar8].value;
              }
              uVar2 = sx_strlen(pcVar9);
              iVar12 = uVar11 + 1;
              if (0 < (int)uVar2) {
                lVar7 = (long)iVar12;
                uVar4 = (ulong)uVar2;
                do {
                  uVar2 = uVar11;
                  if ((data != (char *)0x0) && (lVar7 < lVar10)) {
                    data[lVar7] = *pcVar9;
                  }
                  lVar7 = lVar7 + 1;
                  pcVar9 = pcVar9 + 1;
                  uVar11 = uVar2 + 1;
                  uVar4 = uVar4 - 1;
                } while (uVar4 != 0);
                iVar12 = uVar2 + 2;
              }
              if ((data != (char *)0x0) && (iVar12 < size)) {
                data[iVar12] = '\n';
              }
              uVar11 = uVar11 + 2;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < ini->property_count);
        }
        if (0 < (int)uVar11) {
          if ((data != (char *)0x0) && ((int)uVar11 < size)) {
            data[uVar11] = '\n';
          }
          uVar11 = uVar11 + 1;
        }
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)ini->section_count);
    }
    if ((data != (char *)0x0) && ((int)uVar11 < size)) {
      data[(int)uVar11] = '\0';
    }
    iVar12 = uVar11 + 1;
  }
  return iVar12;
}

Assistant:

int ini_save( ini_t const* ini, char* data, int size )
    {
    int s;
    int p;
    int i;
    int l;
    char* n;
    int pos;

    if( ini )
        {
        pos = 0;
        for( s = 0; s < ini->section_count; ++s )
            {
            n = ini->sections[ s ].name_large ? ini->sections[ s ].name_large : ini->sections[ s ].name;
            l = (int) INI_STRLEN( n );
            if( l > 0 )
                {
                if( data && pos < size ) data[ pos ] = '[';
                ++pos;
                for( i = 0; i < l; ++i )
                    {
                    if( data && pos < size ) data[ pos ] = n[ i ];
                    ++pos;
                    }
                if( data && pos < size ) data[ pos ] = ']';
                ++pos;
                if( data && pos < size ) data[ pos ] = '\n';
                ++pos;
                }

            for( p = 0; p < ini->property_count; ++p )
                {
                if( ini->properties[ p ].section == s )
                    {
                    n = ini->properties[ p ].name_large ? ini->properties[ p ].name_large : ini->properties[ p ].name;
                    l = (int) INI_STRLEN( n );
                    for( i = 0; i < l; ++i )
                        {
                        if( data && pos < size ) data[ pos ] = n[ i ];
                        ++pos;
                        }
                    if( data && pos < size ) data[ pos ] = '=';
                    ++pos;
                    n = ini->properties[ p ].value_large ? ini->properties[ p ].value_large : ini->properties[ p ].value;
                    l = (int) INI_STRLEN( n );
                    for( i = 0; i < l; ++i )
                        {
                        if( data && pos < size ) data[ pos ] = n[ i ];
                        ++pos;
                        }
                    if( data && pos < size ) data[ pos ] = '\n';
                    ++pos;
                    }
                }

            if( pos > 0 )
                {
                if( data && pos < size ) data[ pos ] = '\n';
                ++pos;
                }
            }

        if( data && pos < size ) data[ pos ] = '\0';
        ++pos;

        return pos;
        }

    return 0;
    }